

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexLookupVerifier.cpp
# Opt level: O1

float tcu::computeBilinearSearchStepFromFloatQuad(LookupPrecision *prec,ColorQuad *quad)

{
  float fVar1;
  int i;
  long lVar2;
  uint uVar3;
  float fVar4;
  float afStack_88 [2];
  Vec4 minStep;
  Vec4 stepCount;
  Vec4 maxD;
  Vec4 d3;
  Vec4 d2;
  Vec4 d1;
  Vector<float,_4> res_12;
  Vec4 d0;
  
  d2.m_data[2] = 0.0;
  d2.m_data[3] = 0.0;
  d1.m_data[0] = 0.0;
  d1.m_data[1] = 0.0;
  lVar2 = 0;
  do {
    d2.m_data[lVar2 + 2] = (quad->p10).m_data[lVar2] - (quad->p00).m_data[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 4);
  res_12.m_data[2] = 0.0;
  res_12.m_data[3] = 0.0;
  lVar2 = 0;
  do {
    fVar1 = d2.m_data[lVar2 + 2];
    fVar4 = -fVar1;
    if (-fVar1 <= fVar1) {
      fVar4 = fVar1;
    }
    res_12.m_data[lVar2 + 2] = fVar4;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 4);
  d3.m_data[2] = 0.0;
  d3.m_data[3] = 0.0;
  d2.m_data[0] = 0.0;
  d2.m_data[1] = 0.0;
  lVar2 = 0;
  do {
    d3.m_data[lVar2 + 2] = (quad->p01).m_data[lVar2] - (quad->p00).m_data[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 4);
  d2.m_data[2] = 0.0;
  d2.m_data[3] = 0.0;
  d1.m_data[0] = 0.0;
  d1.m_data[1] = 0.0;
  lVar2 = 0;
  do {
    fVar1 = d3.m_data[lVar2 + 2];
    fVar4 = -fVar1;
    if (-fVar1 <= fVar1) {
      fVar4 = fVar1;
    }
    d2.m_data[lVar2 + 2] = fVar4;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 4);
  maxD.m_data[2] = 0.0;
  maxD.m_data[3] = 0.0;
  d3.m_data[0] = 0.0;
  d3.m_data[1] = 0.0;
  lVar2 = 0;
  do {
    maxD.m_data[lVar2 + 2] = (quad->p11).m_data[lVar2] - (quad->p10).m_data[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 4);
  d3.m_data[2] = 0.0;
  d3.m_data[3] = 0.0;
  d2.m_data[0] = 0.0;
  d2.m_data[1] = 0.0;
  lVar2 = 0;
  do {
    fVar1 = maxD.m_data[lVar2 + 2];
    fVar4 = -fVar1;
    if (-fVar1 <= fVar1) {
      fVar4 = fVar1;
    }
    d3.m_data[lVar2 + 2] = fVar4;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 4);
  stepCount.m_data[2] = 0.0;
  stepCount.m_data[3] = 0.0;
  maxD.m_data[0] = 0.0;
  maxD.m_data[1] = 0.0;
  lVar2 = 0;
  do {
    stepCount.m_data[lVar2 + 2] = (quad->p11).m_data[lVar2] - (quad->p01).m_data[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 4);
  maxD.m_data[2] = 0.0;
  maxD.m_data[3] = 0.0;
  d3.m_data[0] = 0.0;
  d3.m_data[1] = 0.0;
  lVar2 = 0;
  do {
    fVar1 = stepCount.m_data[lVar2 + 2];
    fVar4 = -fVar1;
    if (-fVar1 <= fVar1) {
      fVar4 = fVar1;
    }
    maxD.m_data[lVar2 + 2] = fVar4;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 4);
  minStep.m_data[0] = 0.0;
  minStep.m_data[1] = 0.0;
  lVar2 = 0;
  do {
    uVar3 = -(uint)(maxD.m_data[lVar2 + 2] <= d3.m_data[lVar2 + 2]);
    minStep.m_data[lVar2 + -2] =
         (float)(~uVar3 & (uint)maxD.m_data[lVar2 + 2] | (uint)d3.m_data[lVar2 + 2] & uVar3);
    lVar2 = lVar2 + 1;
  } while (lVar2 != 4);
  minStep.m_data[2] = 0.0;
  minStep.m_data[3] = 0.0;
  stepCount.m_data[0] = 0.0;
  stepCount.m_data[1] = 0.0;
  lVar2 = 0;
  do {
    uVar3 = -(uint)(minStep.m_data[lVar2 + -2] <= d2.m_data[lVar2 + 2]);
    minStep.m_data[lVar2 + 2] =
         (float)(~uVar3 & (uint)minStep.m_data[lVar2 + -2] | (uint)d2.m_data[lVar2 + 2] & uVar3);
    lVar2 = lVar2 + 1;
  } while (lVar2 != 4);
  stepCount.m_data[2] = 0.0;
  stepCount.m_data[3] = 0.0;
  maxD.m_data[0] = 0.0;
  maxD.m_data[1] = 0.0;
  lVar2 = 0;
  do {
    uVar3 = -(uint)(minStep.m_data[lVar2 + 2] <= res_12.m_data[lVar2 + 2]);
    stepCount.m_data[lVar2 + 2] =
         (float)(~uVar3 & (uint)minStep.m_data[lVar2 + 2] | (uint)res_12.m_data[lVar2 + 2] & uVar3);
    lVar2 = lVar2 + 1;
  } while (lVar2 != 4);
  minStep.m_data[2] = 0.0;
  minStep.m_data[3] = 0.0;
  stepCount.m_data[0] = 0.0;
  stepCount.m_data[1] = 0.0;
  lVar2 = 0;
  do {
    minStep.m_data[lVar2 + 2] = stepCount.m_data[lVar2 + 2] / (prec->colorThreshold).m_data[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 4);
  d1.m_data[2] = 0.0;
  d1.m_data[3] = 0.0;
  res_12.m_data[0] = 0.0;
  res_12.m_data[1] = 0.0;
  lVar2 = 0;
  do {
    d1.m_data[lVar2 + 2] = minStep.m_data[lVar2 + 2] + 1.0;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 4);
  minStep.m_data[0] = 0.0;
  minStep.m_data[1] = 0.0;
  lVar2 = 0;
  do {
    minStep.m_data[lVar2 + -2] = 1.0 / d1.m_data[lVar2 + 2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 4);
  lVar2 = 1;
  afStack_88[0] = 0.0;
  do {
    uVar3 = -(uint)(afStack_88[0] <= minStep.m_data[lVar2 + -2]);
    afStack_88[0] = (float)((uint)afStack_88[0] & uVar3 | ~uVar3 & (uint)minStep.m_data[lVar2 + -2])
    ;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 4);
  if (afStack_88[0] <= 1.5258789e-05) {
    afStack_88[0] = 1.5258789e-05;
  }
  return afStack_88[0];
}

Assistant:

static float computeBilinearSearchStepFromFloatQuad (const LookupPrecision&	prec,
													 const ColorQuad&		quad)
{
	DE_ASSERT(boolAll(greaterThan(prec.colorThreshold, Vec4(0.0f))));

	const int		maxSteps	= 1<<16;
	const Vec4		d0			= abs(quad.p10 - quad.p00);
	const Vec4		d1			= abs(quad.p01 - quad.p00);
	const Vec4		d2			= abs(quad.p11 - quad.p10);
	const Vec4		d3			= abs(quad.p11 - quad.p01);
	const Vec4		maxD		= max(d0, max(d1, max(d2, d3)));
	const Vec4		stepCount	= maxD / prec.colorThreshold;
	const Vec4		minStep		= 1.0f / (stepCount + 1.0f);
	const float		step		= de::max(minComp(minStep), 1.0f / float(maxSteps));

	return step;
}